

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rootwindow.cpp
# Opt level: O0

void __thiscall RootWindow::closeExample(RootWindow *this)

{
  element_type *peVar1;
  float *pfVar2;
  AnimationManager *this_00;
  shared_ptr<rengine::AbstractAnimation> local_80;
  shared_ptr<rengine::AbstractAnimation> local_70;
  RootWindow *local_60;
  undefined1 local_58 [8];
  shared_ptr<rengine::Animation_Callback<RootWindow,_&RootWindow::exampleClosed>_> close;
  undefined1 local_38 [8];
  shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>_>
  fade;
  vector<std::shared_ptr<rengine::AbstractAnimation>,_std::allocator<std::shared_ptr<rengine::AbstractAnimation>_>_>
  sequence;
  RootWindow *this_local;
  
  if (this->m_example != (Example *)0x0) {
    animateButtons(this,this->m_example,1.5707964,0.0,0.3);
    std::
    vector<std::shared_ptr<rengine::AbstractAnimation>,_std::allocator<std::shared_ptr<rengine::AbstractAnimation>_>_>
    ::vector((vector<std::shared_ptr<rengine::AbstractAnimation>,_std::allocator<std::shared_ptr<rengine::AbstractAnimation>_>_>
              *)&fade.
                 super___shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount);
    std::
    make_shared<rengine::Animation<rengine::OpacityNode,float,&rengine::OpacityNode::setOpacity,&rengine::AnimationCurves::smooth>,rengine::OpacityNode*&>
              ((OpacityNode **)local_38);
    peVar1 = std::
             __shared_ptr_access<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_38);
    rengine::AbstractAnimation::setDuration(&peVar1->super_AbstractAnimation,0.5);
    peVar1 = std::
             __shared_ptr_access<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_38);
    pfVar2 = rengine::
             Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>
             ::newKeyFrame(peVar1,0.0);
    *pfVar2 = 1.0;
    peVar1 = std::
             __shared_ptr_access<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_38);
    pfVar2 = rengine::
             Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>
             ::newKeyFrame(peVar1,1.0);
    *pfVar2 = 0.0;
    local_60 = this;
    std::make_shared<rengine::Animation_Callback<RootWindow,&RootWindow::exampleClosed>,RootWindow*>
              ((RootWindow **)local_58);
    std::shared_ptr<rengine::AbstractAnimation>::
    shared_ptr<rengine::Animation<rengine::OpacityNode,float,&rengine::OpacityNode::setOpacity,&rengine::AnimationCurves::smooth>,void>
              (&local_70,
               (shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>_>
                *)local_38);
    std::
    vector<std::shared_ptr<rengine::AbstractAnimation>,_std::allocator<std::shared_ptr<rengine::AbstractAnimation>_>_>
    ::push_back((vector<std::shared_ptr<rengine::AbstractAnimation>,_std::allocator<std::shared_ptr<rengine::AbstractAnimation>_>_>
                 *)&fade.
                    super___shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,&local_70);
    std::shared_ptr<rengine::AbstractAnimation>::~shared_ptr(&local_70);
    std::shared_ptr<rengine::AbstractAnimation>::
    shared_ptr<rengine::Animation_Callback<RootWindow,&RootWindow::exampleClosed>,void>
              (&local_80,
               (shared_ptr<rengine::Animation_Callback<RootWindow,_&RootWindow::exampleClosed>_> *)
               local_58);
    std::
    vector<std::shared_ptr<rengine::AbstractAnimation>,_std::allocator<std::shared_ptr<rengine::AbstractAnimation>_>_>
    ::push_back((vector<std::shared_ptr<rengine::AbstractAnimation>,_std::allocator<std::shared_ptr<rengine::AbstractAnimation>_>_>
                 *)&fade.
                    super___shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount,&local_80);
    std::shared_ptr<rengine::AbstractAnimation>::~shared_ptr(&local_80);
    this_00 = rengine::StandardSurface::animationManager(&this->super_StandardSurface);
    rengine::AnimationManager::start
              (this_00,(vector<std::shared_ptr<rengine::AbstractAnimation>,_std::allocator<std::shared_ptr<rengine::AbstractAnimation>_>_>
                        *)&fade.
                           super___shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount,0.0);
    std::shared_ptr<rengine::Animation_Callback<RootWindow,_&RootWindow::exampleClosed>_>::
    ~shared_ptr((shared_ptr<rengine::Animation_Callback<RootWindow,_&RootWindow::exampleClosed>_> *)
                local_58);
    std::
    shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>_>
    ::~shared_ptr((shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>_>
                   *)local_38);
    std::
    vector<std::shared_ptr<rengine::AbstractAnimation>,_std::allocator<std::shared_ptr<rengine::AbstractAnimation>_>_>
    ::~vector((vector<std::shared_ptr<rengine::AbstractAnimation>,_std::allocator<std::shared_ptr<rengine::AbstractAnimation>_>_>
               *)&fade.
                  super___shared_ptr<rengine::Animation<rengine::OpacityNode,_float,_&rengine::OpacityNode::setOpacity,_&rengine::AnimationCurves::smooth>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
    return;
  }
  __assert_fail("m_example",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/examples/rootwindow.cpp"
                ,0x83,"void RootWindow::closeExample()");
}

Assistant:

void RootWindow::closeExample()
{
    assert(m_example);

    animateButtons(m_example, M_PI / 2.0f, 0, 0.3);

    std::vector<std::shared_ptr<AbstractAnimation>> sequence;

    auto fade = std::make_shared<Animation_OpacityNode_opacity>(m_appLayer);
    fade->setDuration(0.5);
    fade->newKeyFrame(0) = 1;
    fade->newKeyFrame(1) = 0;

    auto close = std::make_shared<Animation_Callback<RootWindow, &RootWindow::exampleClosed>>(this);

    sequence.push_back(fade);
    sequence.push_back(close);

    animationManager()->start(sequence, 0);
}